

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O2

void inithess_l(double *H,int N,int k,double *tsk,double *tyk,double *dx)

{
  double *C;
  double *C_00;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  C = (double *)malloc(8);
  C_00 = (double *)malloc(8);
  mmult(tsk,tyk,C,1,N,1);
  mmult(tyk,tyk,C_00,1,N,1);
  if (k < 1) {
    dVar5 = 1.0;
  }
  else {
    dVar5 = *C / *C_00;
  }
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  pdVar3 = H;
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; (uint)N != uVar4; uVar4 = uVar4 + 1) {
      if (uVar1 == uVar4) {
        H[uVar1 + uVar1 * (long)N] = dVar5 * dx[uVar1] * dx[uVar1];
      }
      else {
        pdVar3[uVar4] = 0.0;
      }
    }
    pdVar3 = pdVar3 + N;
  }
  free(C);
  free(C_00);
  return;
}

Assistant:

void inithess_l(double *H, int N, int k, double *tsk,double *tyk, double *dx) {
	int i, j, ct;
	double temp;
	double *num, *den;

	num = (double*)malloc(sizeof(double)*1);
	den = (double*)malloc(sizeof(double)*1);

	mmult(tsk, tyk, num, 1, N, 1);
	mmult(tyk, tyk, den, 1, N, 1);

	if (k > 0) {
		temp = num[0] / den[0];
	}
	else {
		temp = 1.0;
	}

	for (i = 0; i < N; ++i) {
		ct = i *N;
		for (j = 0; j < N; ++j) {
			if (i == j) {
				H[ct + j] = temp * dx[i] * dx[i];
			}
			else {
				H[ct + j] = 0.0;
			}

		}
	}

	free(num);
	free(den);

}